

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

TypeDenoter * __thiscall Parser::parseTypeDenoter(Parser *this)

{
  FILE *pFVar1;
  bool bVar2;
  string *__str;
  char *pcVar3;
  char *pcVar4;
  TypeDenoter *this_00;
  TokenType type_00;
  string local_88;
  string local_68;
  byte local_31;
  undefined1 local_30 [7];
  bool verified;
  string type;
  Parser *this_local;
  
  type.field_2._8_8_ = this;
  __str = Token::getValue_abi_cxx11_(this->currentToken);
  std::__cxx11::string::string((string *)local_30,__str);
  local_31 = 0;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"int");
  if (bVar2) {
    local_31 = 1;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"double");
  if (bVar2) {
    local_31 = 1;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"float");
  if (bVar2) {
    local_31 = 1;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"long");
  if (bVar2) {
    local_31 = 1;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"String");
  if (bVar2) {
    local_31 = 1;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"char");
  pFVar1 = _stderr;
  if (bVar2) {
    local_31 = 1;
  }
  if ((local_31 & 1) == 0) {
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30);
    fprintf(pFVar1,"\nFATAL: Unknown data type \'%s\' is not defined!",pcVar3);
    exit(1);
  }
  loadNextToken(this);
  pFVar1 = _stdout;
  Token::tokenDesc_abi_cxx11_(&local_68,(Token *)0x0,type_00);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (&local_68);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30)
  ;
  fprintf(pFVar1,"\x1b[32m\tParsing [Type (%s) ] \'%s\'\n\x1b[0m",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_68);
  this_00 = (TypeDenoter *)operator_new(0x28);
  Scanner::toUpper(&local_88,(string *)local_30);
  TypeDenoter::TypeDenoter(this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_30);
  return this_00;
}

Assistant:

TypeDenoter *Parser::parseTypeDenoter() {
    std::string type = currentToken->getValue();

    bool verified = false;

#ifdef _INT
    if (type == "int") {
        verified = true;
    }
#endif
#ifdef _DOUBLE
    if (type == "double") {
        verified = true;
    }
#endif
#ifdef _FLOAT
    if (type == "float") {
        verified = true;
    }
#endif
#ifdef _LONG
    if (type == "long") {
        verified = true;
    }
#endif
#ifdef _STRING
    if (type == "String") {
        verified = true;
    }
#endif
#ifdef _CHAR
    if (type == "char") {
        verified = true;
    }
#endif

    if (verified) {
        // Prep next token
        loadNextToken();

        // Debug output
        if (_VERBOSITY >= 3) {
            fprintf(stdout, ANSI_COLOR_GREEN "\tParsing [Type (%s) ] \'%s\'\n" ANSI_COLOR_RESET,
                    Token::tokenDesc(TokenType::IdentifierToken).data(), type.data());
        }

        return new TypeDenoter(Scanner::toUpper(type));
    }

    fprintf(stderr, "\nFATAL: Unknown data type \'%s\' is not defined!", type.data());
    exit(1);
}